

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  sqlite3 *db;
  WhereOrInfo *pWC_00;
  WhereTerm *p;
  int iVar1;
  anon_union_8_3_737c4e49_for_u *paVar2;
  
  db = pWC->pWInfo->pParse->db;
  if (0 < pWC->nTerm) {
    iVar1 = pWC->nTerm + 1;
    paVar2 = &pWC->a->u;
    do {
      if ((((ulong)paVar2->pOrInfo & 0x10000) != 0) &&
         (((WhereTerm *)(paVar2 + -5))->pExpr != (Expr *)0x0)) {
        sqlite3ExprDeleteNN(db,((WhereTerm *)(paVar2 + -5))->pExpr);
      }
      if ((((ulong)paVar2->pOrInfo & 0x100000) != 0) || (((ulong)paVar2->pOrInfo & 0x200000) != 0))
      {
        pWC_00 = paVar2->pOrInfo;
        sqlite3WhereClauseClear(&pWC_00->wc);
        if (pWC_00 != (WhereOrInfo *)0x0) {
          sqlite3DbFreeNN(db,pWC_00);
        }
      }
      iVar1 = iVar1 + -1;
      paVar2 = paVar2 + 8;
    } while (1 < iVar1);
  }
  p = pWC->a;
  if (p == (WhereTerm *)0x0 || p == pWC->aStatic) {
    return;
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pWInfo->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}